

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

int Jf_ManComputeRefs(Jf_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int *piVar2;
  int iVar3;
  int *piVar4;
  float *pfVar5;
  float *pfVar6;
  Jf_Par_t *pJVar7;
  Gia_Man_t *pGVar8;
  Gia_Obj_t *pGVar9;
  word *pwVar10;
  bool bVar11;
  float fVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  
  piVar4 = p->pGia->pRefs;
  if (piVar4 == (int *)0x0) {
    __assert_fail("p->pGia->pRefs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x522,"int Jf_ManComputeRefs(Jf_Man_t *)");
  }
  pfVar5 = (p->vRefs).pArray;
  pfVar6 = (p->vFlow).pArray;
  memset(piVar4,0,(long)p->pGia->nObjs << 2);
  pJVar7 = p->pPars;
  pJVar7->Area = 0;
  pJVar7->Edge = 0;
  pGVar8 = p->pGia;
  lVar14 = (long)pGVar8->nObjs;
  if (0 < lVar14) {
    do {
      if (pGVar8->nObjs < lVar14) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar9 = pGVar8->pObjs;
      if (pGVar9 == (Gia_Obj_t *)0x0) break;
      lVar15 = lVar14 + -1;
      uVar19 = *(ulong *)(pGVar9 + lVar15);
      uVar16 = (uint)uVar19;
      uVar18 = uVar19 & 0x1fffffff;
      if (((int)uVar16 < 0 && uVar18 != 0x1fffffff) ||
         (((-1 < (int)uVar16 && ((uVar16 & 0x1fffffff) != 0x1fffffff)) &&
          ((uVar16 & 0x1fffffff) == ((uint)(uVar19 >> 0x20) & 0x1fffffff))))) {
        pGVar1 = pGVar9 + lVar15 + -uVar18;
        if ((pGVar1 < pGVar9) || (pGVar9 + pGVar8->nObjs <= pGVar1)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        pGVar8->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar9) >> 2) * -0x55555555] =
             pGVar8->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar9) >> 2) * -0x55555555] + 1;
      }
      else if (((int)uVar18 != 0x1fffffff && -1 < (int)uVar16) &&
              (piVar4 = pGVar8->pRefs, 0 < piVar4[lVar15])) {
        if ((uVar16 >> 0x1e & 1) != 0) {
          __assert_fail("Jf_ObjIsUnit(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                        ,0x52b,"int Jf_ManComputeRefs(Jf_Man_t *)");
        }
        if ((p->vCuts).nSize < lVar14) {
LAB_0075b366:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar16 = (p->vCuts).pArray[lVar15];
        pwVar10 = (p->pMem).pPages[(int)uVar16 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        lVar17 = (long)(int)(uVar16 & (p->pMem).uPageMask);
        if ((*(byte *)((long)pwVar10 + lVar17 * 8 + 4) & 0xf) != 0) {
          uVar19 = 0;
          do {
            uVar16 = *(uint *)((long)pwVar10 + uVar19 * 4 + lVar17 * 8 + 8);
            if ((int)uVar16 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            piVar2 = piVar4 + (uVar16 >> 1);
            *piVar2 = *piVar2 + 1;
            uVar19 = uVar19 + 1;
          } while (uVar19 < (*(uint *)((long)pwVar10 + lVar17 * 8 + 4) & 0xf));
        }
        if (pJVar7->fGenCnf != 0) {
          uVar16 = *(uint *)((long)pwVar10 + lVar17 * 8 + 4) >> 9;
          if (p->vCnfs->nSize <= (int)uVar16) goto LAB_0075b366;
          pJVar7->Clause = pJVar7->Clause + (long)p->vCnfs->pArray[uVar16];
        }
        pJVar7->Edge = pJVar7->Edge + (ulong)(*(uint *)((long)pwVar10 + lVar17 * 8 + 4) & 0xf);
        pJVar7->Area = pJVar7->Area + 1;
      }
      bVar11 = 1 < lVar14;
      lVar14 = lVar15;
    } while (bVar11);
  }
  iVar13 = pGVar8->nObjs;
  if (0 < (long)iVar13) {
    iVar3 = pJVar7->fOptEdge;
    lVar14 = 0;
    do {
      if (iVar3 == 0) {
        fVar12 = (float)pGVar8->pRefs[lVar14] * 0.8;
        fVar20 = 0.2;
      }
      else {
        fVar12 = (float)pGVar8->pRefs[lVar14] * 0.2;
        fVar20 = 0.8;
      }
      fVar12 = pfVar5[lVar14] * fVar20 + fVar12;
      fVar20 = 1.0;
      if (1.0 <= fVar12) {
        fVar20 = fVar12;
      }
      pfVar6[lVar14] = (pfVar6[lVar14] * pfVar5[lVar14]) / fVar20;
      pfVar5[lVar14] = fVar20;
      if (pfVar6[lVar14] < 0.0) {
        __assert_fail("pFlow[i] >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                      ,0x53d,"int Jf_ManComputeRefs(Jf_Man_t *)");
      }
      lVar14 = lVar14 + 1;
    } while (iVar13 != lVar14);
  }
  iVar13 = Jf_ManComputeDelay(p,1);
  pJVar7 = p->pPars;
  pJVar7->Delay = (long)iVar13;
  return (int)pJVar7->Area;
}

Assistant:

int Jf_ManComputeRefs( Jf_Man_t * p )
{
    Gia_Obj_t * pObj; 
    float nRefsNew; int i, * pCut;
    float * pRefs = Vec_FltArray(&p->vRefs);
    float * pFlow = Vec_FltArray(&p->vFlow);
    assert( p->pGia->pRefs != NULL );
    memset( p->pGia->pRefs, 0, sizeof(int) * Gia_ManObjNum(p->pGia) );
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachObjReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsCo(pObj) || Gia_ObjIsBuf(pObj) )
            Gia_ObjRefInc( p->pGia, Gia_ObjFanin0(pObj) );
        else if ( Gia_ObjIsAnd(pObj) && Gia_ObjRefNum(p->pGia, pObj) > 0 )
        {
            assert( Jf_ObjIsUnit(pObj) );
            pCut = Jf_ObjCutBest(p, i);
            Jf_CutRef( p, pCut );
            if ( p->pPars->fGenCnf )
            p->pPars->Clause += Jf_CutCnfSize(p, pCut);
            p->pPars->Edge += Jf_CutSize(pCut);
            p->pPars->Area++;
        }
    }
    // blend references and normalize flow
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
    {
        if ( p->pPars->fOptEdge )
            nRefsNew = Abc_MaxFloat( 1, 0.8 * pRefs[i] + 0.2 * p->pGia->pRefs[i] );
        else
            nRefsNew = Abc_MaxFloat( 1, 0.2 * pRefs[i] + 0.8 * p->pGia->pRefs[i] );
        pFlow[i] = pFlow[i] * pRefs[i] / nRefsNew;
        pRefs[i] = nRefsNew;
        assert( pFlow[i] >= 0 );
    }
    // compute delay
    p->pPars->Delay = Jf_ManComputeDelay( p, 1 );
    return p->pPars->Area;
}